

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O1

void nrg::PrioExecution::
     push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>
               (Queue *queue,_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn,
               AsyncResult<int> *param,AsyncResult<int> *param_4,AsyncResult<int> *param_5,
               int *param_6)

{
  uint uVar1;
  QueueElement elem;
  _Any_data local_a0;
  _Manager_type local_90;
  _Invoker_type p_Stack_88;
  undefined1 local_80 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  int local_48;
  QueueElement local_40;
  
  uVar1 = next()::nxt;
  next()::nxt = next()::nxt + 1;
  local_80._8_8_ =
       (param->impl_).super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_80._16_8_ =
       (param->impl_).super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_)->_M_use_count + 1;
    }
  }
  local_80._24_8_ =
       (param_4->impl_).super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_60 = (param_4->impl_).
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  local_58 = (param_5->impl_).
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50 = (param_5->impl_).
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  local_48 = *param_6;
  local_80._0_8_ = fn;
  std::function<void()>::
  function<nrg::PrioExecution::push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>(std::priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>&,void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int&&)::_lambda()_1_,void>
            ((function<void()> *)local_a0._M_pod_data,(anon_class_64_5_11abe806 *)local_80);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._16_8_);
  }
  local_40._0_8_ = (ulong)uVar1 << 0x20;
  local_40.what.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_40.what.super__Function_base._M_functor._8_8_ = 0;
  local_40.what.super__Function_base._M_manager = (_Manager_type)0x0;
  local_40.what._M_invoker = p_Stack_88;
  if (local_90 != (_Manager_type)0x0) {
    local_40.what.super__Function_base._M_functor._M_unused._M_object = local_a0._M_unused._M_object
    ;
    local_40.what.super__Function_base._M_functor._8_8_ = local_a0._8_8_;
    local_40.what.super__Function_base._M_manager = local_90;
    local_90 = (_Manager_type)0x0;
    p_Stack_88 = (_Invoker_type)0x0;
  }
  std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>::
  emplace_back<nrg::PrioExecution::QueueElement>(&queue->c,&local_40);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::PrioExecution::QueueElement*,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>>,std::greater<nrg::PrioExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_40.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.what.super__Function_base._M_manager)
              ((_Any_data *)&local_40.what,(_Any_data *)&local_40.what,__destroy_functor);
  }
  if (local_90 != (_Manager_type)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { 0, next(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }